

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mif_cod.c
# Opt level: O3

int mif_encode(jas_image_t *image,jas_stream_t *out,char *optstr)

{
  jas_image_cmpt_t *pjVar1;
  uchar *puVar2;
  jas_seqent_t **ppjVar3;
  int_fast16_t iVar4;
  jas_matrix_t *pjVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  mif_hdr_t *hdr;
  mif_cmpt_t *pmVar9;
  jas_image_t *image_00;
  jas_matrix_t *data;
  long lVar10;
  long lVar11;
  long width;
  int_fast32_t iVar12;
  long lVar13;
  jas_matrix_t *local_78;
  jas_image_cmptparm_t local_68;
  
  if ((optstr != (char *)0x0) && (*optstr != '\0')) {
    jas_eprintf("warning: ignoring unsupported options\n");
  }
  iVar6 = jas_image_strtofmt("pnm");
  if (iVar6 < 0) {
    jas_eprintf("error: PNM support required\n");
    return -1;
  }
  hdr = mif_hdr_create(image->numcmpts_);
  if (hdr == (mif_hdr_t *)0x0) {
    return -1;
  }
  hdr->magic = 0x4d49460a;
  uVar7 = image->numcmpts_;
  hdr->numcmpts = uVar7;
  if (0 < (int)uVar7) {
    lVar13 = 0;
    do {
      pmVar9 = (mif_cmpt_t *)jas_malloc(0x48);
      hdr->cmpts[lVar13] = pmVar9;
      if (pmVar9 == (mif_cmpt_t *)0x0) {
        iVar6 = hdr->numcmpts;
        if (0 < iVar6) {
          lVar13 = 0;
          do {
            if (hdr->cmpts[lVar13] != (mif_cmpt_t *)0x0) {
              jas_free(hdr->cmpts[lVar13]);
              iVar6 = hdr->numcmpts;
            }
            lVar13 = lVar13 + 1;
          } while (lVar13 < iVar6);
        }
        jas_free(hdr);
        return -1;
      }
      pmVar9 = hdr->cmpts[lVar13];
      pjVar1 = image->cmpts_[lVar13];
      iVar12 = pjVar1->tly_;
      pmVar9->tlx = pjVar1->tlx_;
      pmVar9->tly = iVar12;
      iVar12 = pjVar1->height_;
      pmVar9->width = pjVar1->width_;
      pmVar9->height = iVar12;
      iVar12 = pjVar1->vstep_;
      pmVar9->sampperx = pjVar1->hstep_;
      pmVar9->samppery = iVar12;
      pmVar9->prec = (long)pjVar1->prec_;
      pmVar9->sgnd = (long)pjVar1->sgnd_;
      pmVar9->data = (char *)0x0;
      lVar13 = lVar13 + 1;
    } while (lVar13 < hdr->numcmpts);
  }
  uVar7 = out->flags_;
  if ((uVar7 & 7) == 0) {
    if ((out->rwlimit_ < 0) || (out->rwcnt_ < out->rwlimit_)) {
      *(byte *)&out->bufmode_ = (byte)out->bufmode_ | 0x20;
      iVar8 = out->cnt_;
      out->cnt_ = iVar8 + -1;
      if (iVar8 < 1) {
        iVar8 = jas_stream_flushbuf(out,0x4d);
        if (iVar8 == -1) goto LAB_001344a2;
      }
      else {
        out->rwcnt_ = out->rwcnt_ + 1;
        puVar2 = out->ptr_;
        out->ptr_ = puVar2 + 1;
        *puVar2 = 'M';
      }
      uVar7 = out->flags_;
      if ((uVar7 & 7) != 0) goto LAB_001344a2;
      if ((out->rwlimit_ < 0) || (out->rwcnt_ < out->rwlimit_)) {
        *(byte *)&out->bufmode_ = (byte)out->bufmode_ | 0x20;
        iVar8 = out->cnt_;
        out->cnt_ = iVar8 + -1;
        if (iVar8 < 1) {
          iVar8 = jas_stream_flushbuf(out,0x49);
          if (iVar8 == -1) goto LAB_001344a2;
        }
        else {
          out->rwcnt_ = out->rwcnt_ + 1;
          puVar2 = out->ptr_;
          out->ptr_ = puVar2 + 1;
          *puVar2 = 'I';
        }
        uVar7 = out->flags_;
        if ((uVar7 & 7) != 0) goto LAB_001344a2;
        if ((out->rwlimit_ < 0) || (out->rwcnt_ < out->rwlimit_)) {
          *(byte *)&out->bufmode_ = (byte)out->bufmode_ | 0x20;
          iVar8 = out->cnt_;
          out->cnt_ = iVar8 + -1;
          if (iVar8 < 1) {
            iVar8 = jas_stream_flushbuf(out,0x46);
            if (iVar8 == -1) goto LAB_001344a2;
          }
          else {
            out->rwcnt_ = out->rwcnt_ + 1;
            puVar2 = out->ptr_;
            out->ptr_ = puVar2 + 1;
            *puVar2 = 'F';
          }
          uVar7 = out->flags_;
          if ((uVar7 & 7) != 0) goto LAB_001344a2;
          if ((out->rwlimit_ < 0) || (out->rwcnt_ < out->rwlimit_)) {
            *(byte *)&out->bufmode_ = (byte)out->bufmode_ | 0x20;
            iVar8 = out->cnt_;
            out->cnt_ = iVar8 + -1;
            if (iVar8 < 1) {
              iVar8 = jas_stream_flushbuf(out,10);
              if (iVar8 == -1) goto LAB_001344a2;
            }
            else {
              out->rwcnt_ = out->rwcnt_ + 1;
              puVar2 = out->ptr_;
              out->ptr_ = puVar2 + 1;
              *puVar2 = '\n';
            }
            if (0 < hdr->numcmpts) {
              lVar13 = 0;
              do {
                pmVar9 = hdr->cmpts[lVar13];
                jas_stream_printf(out,
                                  "component tlx=%ld tly=%ld sampperx=%ld samppery=%ld width=%ld height=%ld prec=%d sgnd=%d"
                                  ,pmVar9->tlx,pmVar9->tly,pmVar9->sampperx,pmVar9->samppery,
                                  pmVar9->width,(int)pmVar9->height,(int)pmVar9->prec,
                                  (int)pmVar9->sgnd);
                if (pmVar9->data != (char *)0x0) {
                  jas_stream_printf(out," data=%s");
                }
                jas_stream_printf(out,"\n");
                lVar13 = lVar13 + 1;
              } while (lVar13 < hdr->numcmpts);
            }
            jas_stream_printf(out,"end\n");
            iVar8 = hdr->numcmpts;
            if (0 < iVar8) {
              local_78 = (jas_matrix_t *)0x0;
              lVar13 = 0;
              do {
                pmVar9 = hdr->cmpts[lVar13];
                if (pmVar9->data == (char *)0x0) {
                  image_00 = jas_image_create0();
                  if (image_00 == (jas_image_t *)0x0) goto LAB_001344a2;
                  local_68.tlx = 0;
                  local_68.tly = 0;
                  local_68.hstep = pmVar9->sampperx;
                  local_68.vstep = pmVar9->samppery;
                  local_68.width = pmVar9->width;
                  local_68.height = pmVar9->height;
                  local_68.prec = (int)pmVar9->prec;
                  local_68.sgnd = 0;
                  iVar8 = jas_image_addcmpt(image_00,image_00->numcmpts_,&local_68);
                  pjVar5 = local_78;
                  if (iVar8 != 0) {
LAB_001348ef:
                    local_78 = pjVar5;
                    mif_hdr_destroy(hdr);
                    jas_image_destroy(image_00);
                    if (local_78 == (jas_matrix_t *)0x0) {
                      return -1;
                    }
                    jas_matrix_destroy(local_78);
                    return -1;
                  }
                  image_00->clrspc_ = 0x301;
                  (*image_00->cmpts_)->type_ = 0;
                  data = jas_seq2d_create(0,0,pmVar9->width,pmVar9->height);
                  if ((data == (jas_matrix_t *)0x0) ||
                     (iVar8 = jas_image_readcmpt(image,(uint)lVar13,0,0,pmVar9->width,pmVar9->height
                                                 ,data), pjVar5 = data, iVar8 != 0))
                  goto LAB_001348ef;
                  if (pmVar9->sgnd == 0) {
                    width = pmVar9->width;
                    iVar12 = pmVar9->height;
                  }
                  else {
                    width = pmVar9->width;
                    iVar12 = pmVar9->height;
                    if (0 < iVar12) {
                      iVar4 = pmVar9->prec;
                      lVar10 = 0;
                      do {
                        if (0 < width) {
                          ppjVar3 = data->rows_;
                          lVar11 = 0;
                          do {
                            ppjVar3[lVar10 - data->ystart_][lVar11 - data->xstart_] =
                                 ppjVar3[lVar10 - data->ystart_][lVar11 - data->xstart_] +
                                 (long)(1 << ((char)iVar4 - 1U & 0x1f));
                            lVar11 = lVar11 + 1;
                            width = pmVar9->width;
                          } while (lVar11 < width);
                          iVar12 = pmVar9->height;
                        }
                        lVar10 = lVar10 + 1;
                      } while (lVar10 < iVar12);
                    }
                  }
                  iVar8 = jas_image_writecmpt(image_00,0,0,0,width,iVar12,data);
                  if (iVar8 != 0) goto LAB_001348ef;
                  jas_matrix_destroy(data);
                  iVar8 = jas_image_encode(image_00,out,iVar6,(char *)0x0);
                  pjVar5 = local_78;
                  if (iVar8 != 0) goto LAB_001348ef;
                  jas_image_destroy(image_00);
                  iVar8 = hdr->numcmpts;
                }
                lVar13 = lVar13 + 1;
              } while (lVar13 < iVar8);
            }
            mif_hdr_destroy(hdr);
            return 0;
          }
        }
      }
    }
    out->flags_ = uVar7 | 4;
  }
LAB_001344a2:
  mif_hdr_destroy(hdr);
  return -1;
}

Assistant:

int mif_encode(jas_image_t *image, jas_stream_t *out, const char *optstr)
{
	mif_hdr_t *hdr;
	jas_image_t *tmpimage;
	int fmt;
	int cmptno;
	mif_cmpt_t *cmpt;
	jas_image_cmptparm_t cmptparm;
	jas_seq2d_t *data;
	int_fast32_t x;
	int_fast32_t y;
	int bias;

	hdr = 0;
	tmpimage = 0;
	data = 0;

	if (optstr && *optstr != '\0') {
		jas_eprintf("warning: ignoring unsupported options\n");
	}

	if ((fmt = jas_image_strtofmt("pnm")) < 0) {
		jas_eprintf("error: PNM support required\n");
		goto error;
	}

	if (!(hdr = mif_makehdrfromimage(image))) {
		goto error;
	}
	if (mif_hdr_put(hdr, out)) {
		goto error;
	}

	/* Output component data. */
	for (cmptno = 0; cmptno < hdr->numcmpts; ++cmptno) {
		cmpt = hdr->cmpts[cmptno];
		if (!cmpt->data) {
			if (!(tmpimage = jas_image_create0())) {
				goto error;
			}	
			cmptparm.tlx = 0;
			cmptparm.tly = 0;
			cmptparm.hstep = cmpt->sampperx;
			cmptparm.vstep = cmpt->samppery;
			cmptparm.width = cmpt->width;
			cmptparm.height = cmpt->height;
			cmptparm.prec = cmpt->prec;
			cmptparm.sgnd = false;
			if (jas_image_addcmpt(tmpimage, jas_image_numcmpts(tmpimage),
			  &cmptparm)) {
				goto error;
			}
			jas_image_setclrspc(tmpimage, JAS_CLRSPC_SGRAY);
			jas_image_setcmpttype(tmpimage, 0,
			  JAS_IMAGE_CT_COLOR(JAS_CLRSPC_CHANIND_GRAY_Y));
			if (!(data = jas_seq2d_create(0, 0, cmpt->width, cmpt->height))) {
				goto error;
			}
			if (jas_image_readcmpt(image, cmptno, 0, 0, cmpt->width,
			  cmpt->height, data)) {
				goto error;
			}
			if (cmpt->sgnd) {
				bias = 1 << (cmpt->prec - 1);
				for (y = 0; y < cmpt->height; ++y) {
					for (x = 0; x < cmpt->width; ++x) {
						*jas_seq2d_getref(data, x, y) += bias;
					}
				}
			}
			if (jas_image_writecmpt(tmpimage, 0, 0, 0, cmpt->width,
			  cmpt->height, data)) {
				goto error;
			}
			jas_seq2d_destroy(data);
			data = 0;
			if (jas_image_encode(tmpimage, out, fmt, 0)) {
				goto error;
			}
			jas_image_destroy(tmpimage);
			tmpimage = 0;
		}
	}

	mif_hdr_destroy(hdr);

	return 0;

error:
	if (hdr) {
		mif_hdr_destroy(hdr);
	}
	if (tmpimage) {
		jas_image_destroy(tmpimage);
	}
	if (data) {
		jas_seq2d_destroy(data);
	}
	return -1;
}